

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

int reject_dns_name_in_common_name(X509 *x509)

{
  int iVar1;
  int looks_like_dns;
  int idlen;
  uchar *idval;
  ASN1_STRING *common_name;
  X509_NAME_ENTRY *entry;
  X509_NAME *pXStack_20;
  int i;
  X509_NAME *name;
  X509 *x509_local;
  
  name = (X509_NAME *)x509;
  pXStack_20 = X509_get_subject_name((X509 *)x509);
  entry._4_4_ = -1;
  while( true ) {
    entry._4_4_ = X509_NAME_get_index_by_NID(pXStack_20,0xd,entry._4_4_);
    if (entry._4_4_ == -1) {
      return 0;
    }
    common_name = (ASN1_STRING *)X509_NAME_get_entry(pXStack_20,entry._4_4_);
    idval = (uchar *)X509_NAME_ENTRY_get_data((X509_NAME_ENTRY *)common_name);
    iVar1 = ASN1_STRING_to_UTF8((uchar **)&looks_like_dns,(ASN1_STRING *)idval);
    if (iVar1 < 0) break;
    iVar1 = x509v3_looks_like_dns_name(_looks_like_dns,(long)iVar1);
    OPENSSL_free(_looks_like_dns);
    if (iVar1 != 0) {
      return 0x43;
    }
  }
  return 0x11;
}

Assistant:

static int reject_dns_name_in_common_name(X509 *x509) {
  const X509_NAME *name = X509_get_subject_name(x509);
  int i = -1;
  for (;;) {
    i = X509_NAME_get_index_by_NID(name, NID_commonName, i);
    if (i == -1) {
      return X509_V_OK;
    }

    const X509_NAME_ENTRY *entry = X509_NAME_get_entry(name, i);
    const ASN1_STRING *common_name = X509_NAME_ENTRY_get_data(entry);
    unsigned char *idval;
    int idlen = ASN1_STRING_to_UTF8(&idval, common_name);
    if (idlen < 0) {
      return X509_V_ERR_OUT_OF_MEM;
    }
    // Only process attributes that look like host names. Note it is
    // important that this check be mirrored in |X509_check_host|.
    int looks_like_dns = x509v3_looks_like_dns_name(idval, (size_t)idlen);
    OPENSSL_free(idval);
    if (looks_like_dns) {
      return X509_V_ERR_NAME_CONSTRAINTS_WITHOUT_SANS;
    }
  }
}